

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

cf_errno_t cf_thread_attr_init(cf_thread_attr_t *attr)

{
  int iVar1;
  cf_thread_attr_t *attr_local;
  
  if (attr == (cf_thread_attr_t *)0x0) {
    attr_local._4_4_ = 2;
  }
  else {
    iVar1 = pthread_attr_init((pthread_attr_t *)attr);
    if (iVar1 == 0) {
      attr_local._4_4_ = 0;
    }
    else {
      attr_local._4_4_ = 1;
    }
  }
  return attr_local._4_4_;
}

Assistant:

cf_errno_t cf_thread_attr_init(cf_thread_attr_t* attr) {
#ifdef CF_OS_WIN
    return CF_OK;
#else
    if(!attr) return CF_EPARAM;
    if(pthread_attr_init(attr) == 0) return CF_OK;
    else return CF_NOK;
#endif
}